

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary.cpp
# Opt level: O3

bool __thiscall
CaDiCaL::Internal::hyper_ternary_resolve(Internal *this,Clause *c,int pivot,Clause *d)

{
  int64_t *piVar1;
  int iVar2;
  int iVar3;
  iterator iVar4;
  int *piVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  Clause *pCVar9;
  int *lit;
  
  piVar1 = &(this->stats).ternres;
  *piVar1 = *piVar1 + 1;
  if ((long)c->size != 0) {
    lVar8 = (long)c->size << 2;
    pCVar9 = c + 1;
    do {
      if (*(int *)&pCVar9->field_0 != pivot) {
        iVar4._M_current =
             (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->clause,iVar4,(int *)pCVar9);
        }
        else {
          *iVar4._M_current = *(int *)&pCVar9->field_0;
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      pCVar9 = (Clause *)((long)&pCVar9->field_0 + 4);
      lVar8 = lVar8 + -4;
    } while (lVar8 != 0);
  }
  if ((long)d->size != 0) {
    lVar8 = (long)d->size << 2;
    pCVar9 = d + 1;
    do {
      iVar2 = *(int *)&pCVar9->field_0;
      if (iVar2 != -pivot) {
        piVar5 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = *piVar5;
        if (iVar2 != iVar3) {
          if (iVar3 + iVar2 == 0) goto LAB_00845a2d;
          iVar3 = piVar5[1];
          if (iVar2 != iVar3) {
            if (iVar3 + iVar2 == 0) goto LAB_00845a2d;
            iVar4._M_current =
                 (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->clause,iVar4,(int *)pCVar9);
            }
            else {
              *iVar4._M_current = iVar2;
              (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
          }
        }
      }
      pCVar9 = (Clause *)((long)&pCVar9->field_0 + 4);
      lVar8 = lVar8 + -4;
    } while (lVar8 != 0);
  }
  piVar5 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
  if (uVar7 < 4) {
    if (uVar7 == 3) {
      bVar6 = ternary_find_ternary_clause(this,*piVar5,piVar5[1],piVar5[2]);
LAB_00845a29:
      if (bVar6 != false) goto LAB_00845a2d;
    }
    else if (uVar7 == 2) {
      bVar6 = ternary_find_binary_clause(this,*piVar5,piVar5[1]);
      goto LAB_00845a29;
    }
    bVar6 = true;
  }
  else {
LAB_00845a2d:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool Internal::hyper_ternary_resolve (Clause *c, int pivot, Clause *d) {
  LOG ("hyper binary resolving on pivot %d", pivot);
  LOG (c, "1st antecedent");
  LOG (d, "2nd antecedent");
  stats.ternres++;
  assert (c->size == 3);
  assert (d->size == 3);
  assert (clause.empty ());
  for (const auto &lit : *c)
    if (lit != pivot)
      clause.push_back (lit);
  for (const auto &lit : *d) {
    if (lit == -pivot)
      continue;
    if (lit == clause[0])
      continue;
    if (lit == -clause[0])
      return false;
    if (lit == clause[1])
      continue;
    if (lit == -clause[1])
      return false;
    clause.push_back (lit);
  }
  size_t size = clause.size ();
  if (size > 3)
    return false;
  if (size == 2 && ternary_find_binary_clause (clause[0], clause[1]))
    return false;
  if (size == 3 &&
      ternary_find_ternary_clause (clause[0], clause[1], clause[2]))
    return false;
  return true;
}